

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>::transform
          (LightNodeImpl<embree::SceneGraph::PointLight> *this,AffineSpace3fa *space)

{
  PointLight *this_00;
  AffineSpace3fa *in_RSI;
  LightNodeImpl<embree::SceneGraph::PointLight> *in_RDI;
  LightNodeImpl<embree::SceneGraph::PointLight> *this_01;
  
  this_01 = in_RDI;
  this_00 = (PointLight *)operator_new(0x18948a);
  PointLight::transform(this_00,in_RSI);
  LightNodeImpl(this_01,(PointLight *)in_RDI);
  (in_RDI->super_LightNode).super_Node.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  if ((in_RDI->super_LightNode).super_Node.super_RefCount._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_LightNode).super_Node.super_RefCount._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::LightNode>)&this_01->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }